

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  truncating_iterator<char_*,_std::integral_constant<bool,_false>_> out;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  int in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  undefined8 local_28;
  undefined8 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe8;
  undefined7 in_stack_ffffffffffffffe9;
  
  out.super_truncating_iterator_base<char_*>.limit_._0_1_ = in_stack_ffffffffffffffe8;
  out.super_truncating_iterator_base<char_*>.out_ = (char *)in_stack_ffffffffffffffe0;
  out.super_truncating_iterator_base<char_*>.limit_._1_7_ = in_stack_ffffffffffffffe9;
  out.super_truncating_iterator_base<char_*>.count_ = (size_t)in_RSI;
  out._24_8_ = in_RDI;
  internal::
  format_decimal<char,fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,unsigned_int>
            (out,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  *in_RSI = CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  in_RSI[1] = local_28;
  in_RSI[2] = in_stack_ffffffffffffffe0;
  *(undefined1 *)(in_RSI + 3) = in_stack_ffffffffffffffe8;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }